

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O1

int __thiscall cmCTestBuildAndTestHandler::ProcessHandler(cmCTestBuildAndTestHandler *this)

{
  int iVar1;
  string output;
  
  std::__cxx11::string::_M_replace
            ((ulong)&this->Output,0,(char *)(this->Output)._M_string_length,0x674b0e);
  cmSystemTools::s_FatalErrorOccured = false;
  cmSystemTools::s_ErrorOccured = false;
  iVar1 = RunCMakeAndTest(this,&this->Output);
  cmSystemTools::s_FatalErrorOccured = false;
  cmSystemTools::s_ErrorOccured = false;
  return iVar1;
}

Assistant:

int cmCTestBuildAndTestHandler::ProcessHandler()
{
  this->Output = "";
  std::string output;
  cmSystemTools::ResetErrorOccuredFlag();
  int retv = this->RunCMakeAndTest(&this->Output);
  cmSystemTools::ResetErrorOccuredFlag();
  return retv;
}